

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

void __thiscall
TStokesAnalytic::uxy<Fad<double>>
          (TStokesAnalytic *this,TPZVec<Fad<double>_> *x,TPZVec<Fad<double>_> *flux)

{
  undefined1 *puVar1;
  double dVar2;
  Fad<double> x2;
  Fad<double> x1;
  Fad<double> x3;
  undefined1 local_2d0 [16];
  TPZVec<Fad<double>_> *pTStack_2c0;
  double *pdStack_2b8;
  TPZVec<Fad<double>_> *local_2b0;
  undefined1 local_2a8 [16];
  TPZVec<Fad<double>_> *local_298;
  TPZVec<Fad<double>_> *pTStack_290;
  TPZVec<Fad<double>_> *local_288;
  undefined1 local_280 [16];
  TPZVec<Fad<double>_> *pTStack_270;
  TPZVec<Fad<double>_> *pTStack_268;
  Fad<double> *local_260;
  TPZVec<Fad<double>_> *local_258;
  undefined8 uStack_250;
  undefined1 local_248 [24];
  TPZVec<Fad<double>_> *pTStack_230;
  undefined1 local_220 [24];
  TPZVec<Fad<double>_> *pTStack_208;
  TPZVec<Fad<double>_> local_1f8;
  undefined1 local_1d8 [24];
  TPZVec<Fad<double>_> *local_1c0;
  Fad<double> local_1b0;
  FadExpr<FadFuncSin<Fad<double>_>_> local_190;
  undefined1 local_168 [24];
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
  *local_150;
  TPZVec<Fad<double>_> *local_148;
  undefined8 uStack_140;
  FadExpr<FadFuncSin<Fad<double>_>_> local_130;
  Fad<double> local_108;
  FadExpr<FadFuncCos<Fad<double>_>_> *local_e8;
  FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_> local_e0;
  FadExpr<FadFuncCos<Fad<double>_>_> **local_d8;
  Fad<double> *local_d0;
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
  local_c8;
  TPZVec<Fad<double>_> *local_b8;
  undefined8 uStack_b0;
  FadExpr<FadFuncSin<Fad<double>_>_> *local_a0;
  FadExpr<FadFuncSin<Fad<double>_>_> *local_98;
  FadExpr<FadFuncCos<Fad<double>_>_> ***local_90;
  FadExpr<FadFuncSin<Fad<double>_>_> **local_88;
  TPZVec<Fad<double>_> local_80;
  FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
  local_60;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
  local_50;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>_>_>
  local_40;
  
  Fad<double>::Fad(&local_1b0,x->fStore);
  Fad<double>::Fad((Fad<double> *)&local_1f8,x->fStore + 1);
  Fad<double>::Fad(&local_108,x->fStore + 2);
  switch(this->fExactSol) {
  case EKovasznay:
  case EKovasznayCDG:
    dVar2 = 1.0 / this->fvisco;
    local_258 = (TPZVec<Fad<double>_> *)(dVar2 * 0.5);
    dVar2 = this->Pi * 4.0 * this->Pi + dVar2 * dVar2 * 0.25;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    pTStack_2c0 = (TPZVec<Fad<double>_> *)((double)local_258 - dVar2);
    pdStack_2b8 = (double *)0x0;
    local_298 = (TPZVec<Fad<double>_> *)(this->Pi + this->Pi);
    pTStack_290 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_268 = (TPZVec<Fad<double>_> *)local_248;
    local_280._8_8_ = (Fad<double> *)0x3ff0000000000000;
    pTStack_270 = (TPZVec<Fad<double>_> *)0x0;
    local_2b0 = (TPZVec<Fad<double>_> *)&local_1b0;
    local_288 = &local_1f8;
    local_258 = pTStack_2c0;
    local_248._0_8_ = (TPZVec<Fad<double>_> *)local_2d0;
    local_248._8_8_ = (Fad<double> *)local_2a8;
    Fad<double>::operator=
              (flux->fStore,
               (FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>_>
                *)local_280);
    local_298 = (TPZVec<Fad<double>_> *)(this->Pi + this->Pi);
    pTStack_2c0 = local_258;
    local_280._8_8_ = (double)local_258 / (double)local_298;
    pdStack_2b8 = (double *)0x0;
    pTStack_270 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_290 = (TPZVec<Fad<double>_> *)0x0;
    local_288 = &local_1f8;
    local_2b0 = (TPZVec<Fad<double>_> *)&local_1b0;
    pTStack_268 = (TPZVec<Fad<double>_> *)local_2d0;
    local_248._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_280;
    local_248._8_8_ = (Fad<double> *)local_2a8;
    Fad<double>::operator=
              (flux->fStore + 1,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)local_248);
    break;
  case ESinCos:
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2d0,&local_1b0);
    local_280._8_8_ = (Fad<double> *)0xbff0000000000000;
    pTStack_270 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_268 = (TPZVec<Fad<double>_> *)local_2d0;
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a8,(Fad<double> *)&local_1f8);
    local_248._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_280;
    local_248._8_8_ = (Fad<double> *)local_2a8;
    Fad<double>::operator=
              (flux->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)local_248);
    Fad<double>::~Fad((Fad<double> *)(local_2a8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2d0 + 8));
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2d0,&local_1b0);
    local_280._8_8_ = (TPZVec<Fad<double>_> *)0xbff0000000000000;
    pTStack_270 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_268 = (TPZVec<Fad<double>_> *)local_2d0;
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a8,(Fad<double> *)&local_1f8);
    local_248._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_280;
    local_248._8_8_ = (Fad<double> *)local_2a8;
    Fad<double>::operator=
              (flux->fStore + 1,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)local_248);
    goto LAB_0121ec36;
  case ENoFlow:
    local_2d0._8_8_ = (Fad<double> *)0x0;
    pTStack_2c0 = (TPZVec<Fad<double>_> *)0x0;
    local_2d0._0_8_ = &local_1b0;
    Fad<double>::operator=
              (flux->fStore,(FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)local_2d0);
    local_2d0._8_8_ = (Fad<double> *)0x0;
    pTStack_2c0 = (TPZVec<Fad<double>_> *)0x0;
    local_2d0._0_8_ = &local_1b0;
    Fad<double>::operator=
              (flux->fStore + 1,(FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)local_2d0);
    break;
  case ESinCos3D:
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2d0,&local_1b0);
    local_248._0_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_2d0;
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a8,(Fad<double> *)&local_1f8);
    local_280._0_8_ = local_248;
    local_280._8_8_ = (Fad<double> *)local_2a8;
    Fad<double>::operator=
              (flux->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)local_280);
    Fad<double>::~Fad((Fad<double> *)(local_2a8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2d0 + 8));
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2d0,&local_1b0);
    local_190._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_2d0;
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a8,(Fad<double> *)&local_1f8);
    local_1d8._0_8_ = &local_190;
    local_1d8._8_8_ = (TPZVec<Fad<double>_> *)local_2a8;
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_280,(Fad<double> *)&local_1f8);
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_248,&local_108);
    local_220._8_8_ = &local_130;
    local_220._0_8_ = local_1d8;
    local_130._0_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_280;
    local_130.fadexpr_.expr_.val_ = (double)local_248;
    Fad<double>::operator=
              (flux->fStore + 1,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)local_220);
    Fad<double>::~Fad((Fad<double> *)(local_248 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_280 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2a8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2d0 + 8));
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2d0,(Fad<double> *)&local_1f8);
    local_248._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_2d0;
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a8,&local_108);
    local_280._0_8_ = (Fad<double> *)local_248;
    local_280._8_8_ = (TPZVec<Fad<double>_> *)local_2a8;
    Fad<double>::operator=
              (flux->fStore + 2,
               (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)local_280);
    goto LAB_0121ec36;
  case EPconst:
    Fad<double>::operator=(flux->fStore,&local_1b0);
    local_2d0._0_8_ = (Fad<double> *)&local_1f8;
    Fad<double>::operator=(flux->fStore + 1,(FadExpr<FadUnaryMin<Fad<double>_>_> *)local_2d0);
    break;
  default:
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
               ,0x8c0);
  case ESinCosBDS:
    local_258 = (TPZVec<Fad<double>_> *)exp(this->fcBrinkman / this->fvisco);
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2d0,&local_1b0);
    local_258 = (TPZVec<Fad<double>_> *)(1.0 / (double)local_258);
    uStack_250 = 0;
    local_220._8_8_ = -(double)local_258;
    uStack_140 = 0x8000000000000000;
    local_220._16_8_ = (double *)0x0;
    pTStack_208 = (TPZVec<Fad<double>_> *)local_2d0;
    local_148 = (TPZVec<Fad<double>_> *)local_220._8_8_;
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a8,(Fad<double> *)&local_1f8);
    local_190._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_220;
    local_190.fadexpr_.expr_.val_ = (double)local_2a8;
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_280,&local_1b0);
    local_258 = (TPZVec<Fad<double>_> *)(1.0 - (double)local_258);
    local_1d8._16_8_ = (double *)0x0;
    local_1d8._8_8_ = local_258;
    local_1c0 = (TPZVec<Fad<double>_> *)local_280;
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_248,(Fad<double> *)&local_1f8);
    local_168._0_8_ = (TPZVec<Fad<double>_> *)local_1d8;
    local_168._8_8_ = (Fad<double> *)local_248;
    local_130._0_8_ = &local_190;
    local_130.fadexpr_.expr_.val_ = (double)local_168;
    Fad<double>::operator=
              (flux->fStore,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)&local_130);
    Fad<double>::~Fad((Fad<double> *)(local_248 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_280 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2a8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2d0 + 8));
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2d0,&local_1b0);
    local_220._8_8_ = local_148;
    local_220._16_8_ = (double *)0x0;
    pTStack_208 = (TPZVec<Fad<double>_> *)local_2d0;
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a8,(Fad<double> *)&local_1f8);
    local_190._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_220;
    local_190.fadexpr_.expr_.val_ = (double)local_2a8;
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_280,&local_1b0);
    local_1d8._8_8_ = local_258;
    local_1d8._16_8_ = (double *)0x0;
    local_1c0 = (TPZVec<Fad<double>_> *)local_280;
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_248,(Fad<double> *)&local_1f8);
    local_168._0_8_ = (TPZVec<Fad<double>_> *)local_1d8;
    local_168._8_8_ = (Fad<double> *)local_248;
    local_130._0_8_ = &local_190;
    local_130.fadexpr_.expr_.val_ = (double)local_168;
    Fad<double>::operator=
              (flux->fStore + 1,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
                *)&local_130);
    goto LAB_0121eb24;
  case ESinCosBDS3D:
    local_258 = (TPZVec<Fad<double>_> *)exp(this->fcBrinkman / this->fvisco);
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2d0,&local_1b0);
    local_258 = (TPZVec<Fad<double>_> *)(1.0 / (double)local_258);
    uStack_250 = 0;
    local_220._8_8_ = -(double)local_258;
    uStack_b0 = 0x8000000000000000;
    local_220._16_8_ = (double *)0x0;
    pTStack_208 = (TPZVec<Fad<double>_> *)local_2d0;
    local_b8 = (TPZVec<Fad<double>_> *)local_220._8_8_;
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a8,(Fad<double> *)&local_1f8);
    local_190._0_8_ = local_220;
    local_190.fadexpr_.expr_.val_ = (double)local_2a8;
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_280,&local_1b0);
    local_1d8._8_8_ = 1.0 - (double)local_258;
    local_1d8._16_8_ = (double *)0x0;
    local_1c0 = (TPZVec<Fad<double>_> *)local_280;
    local_148 = (TPZVec<Fad<double>_> *)local_1d8._8_8_;
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_248,(Fad<double> *)&local_1f8);
    local_168._0_8_ = local_1d8;
    local_130.fadexpr_.expr_.val_ = (double)local_168;
    local_130._0_8_ = &local_190;
    local_168._8_8_ = (Fad<double> *)local_248;
    Fad<double>::operator=
              (flux->fStore,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)&local_130);
    Fad<double>::~Fad((Fad<double> *)(local_248 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_280 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2a8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2d0 + 8));
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2d0,&local_1b0);
    local_e0.fadexpr_.expr_ =
         (FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>)
         (FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>)local_2d0;
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a8,(Fad<double> *)&local_1f8);
    local_c8.fadexpr_.left_ = &local_e0;
    local_c8.fadexpr_.right_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a8;
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_280,(Fad<double> *)&local_1f8);
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_248,&local_108);
    local_50.fadexpr_.right_ = &local_60;
    local_50.fadexpr_.left_ = &local_c8;
    local_150 = &local_50;
    local_168._8_8_ = local_258;
    local_168._16_8_ = (double *)0x0;
    local_60.fadexpr_.left_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_280;
    local_60.fadexpr_.right_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_248;
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_220,&local_1b0);
    local_e8 = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_220;
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_1d8,(Fad<double> *)&local_1f8);
    local_d8 = &local_e8;
    local_d0 = (Fad<double> *)local_1d8;
    sin<double>(&local_130,(Fad<double> *)&local_1f8);
    sin<double>(&local_190,&local_108);
    local_88 = &local_a0;
    local_90 = &local_d8;
    local_80.fNAlloc = (int64_t)&local_90;
    local_80.fStore = (Fad<double> *)local_148;
    local_80.fNElements = 0;
    local_40.fadexpr_.left_ =
         (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
          *)local_168;
    local_a0 = &local_130;
    local_98 = &local_190;
    local_40.fadexpr_.right_ =
         (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
          *)&local_80;
    Fad<double>::operator=(flux->fStore + 1,&local_40);
    Fad<double>::~Fad(&local_190.fadexpr_.expr_);
    Fad<double>::~Fad(&local_130.fadexpr_.expr_);
    Fad<double>::~Fad((Fad<double> *)(local_1d8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_220 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_248 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_280 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2a8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2d0 + 8));
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2d0,(Fad<double> *)&local_1f8);
    local_220._8_8_ = local_b8;
    local_220._16_8_ = (double *)0x0;
    pTStack_208 = (TPZVec<Fad<double>_> *)local_2d0;
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a8,&local_108);
    local_190._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_220;
    local_190.fadexpr_.expr_.val_ = (double)local_2a8;
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_280,(Fad<double> *)&local_1f8);
    local_80._vptr_TPZVec = (_func_int **)local_280;
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_248,&local_108);
    local_1d8._8_8_ = local_148;
    local_1d8._16_8_ = (double *)0x0;
    local_1c0 = (TPZVec<Fad<double>_> *)local_168;
    local_168._0_8_ = &local_80;
    local_168._8_8_ = (Fad<double> *)local_248;
    local_130._0_8_ = &local_190;
    local_130.fadexpr_.expr_.val_ = (double)local_1d8;
    Fad<double>::operator=
              (flux->fStore + 2,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>_>_>
                *)&local_130);
LAB_0121eb24:
    Fad<double>::~Fad((Fad<double> *)(local_248 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_280 + 8));
LAB_0121ec36:
    Fad<double>::~Fad((Fad<double> *)(local_2a8 + 8));
    puVar1 = local_2d0;
LAB_0121ec45:
    Fad<double>::~Fad((Fad<double> *)(puVar1 + 8));
    break;
  case EGatica3D:
    pTStack_2c0 = (TPZVec<Fad<double>_> *)this->Pi;
    local_220._0_8_ = local_2d0;
    pdStack_2b8 = (double *)0x0;
    pTStack_290 = (TPZVec<Fad<double>_> *)0x0;
    local_248._8_8_ = local_280;
    pTStack_268 = (TPZVec<Fad<double>_> *)0x0;
    local_2b0 = (TPZVec<Fad<double>_> *)&local_1b0;
    local_298 = pTStack_2c0;
    local_288 = &local_1f8;
    pTStack_270 = pTStack_2c0;
    local_260 = &local_108;
    local_248._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_220;
    local_220._8_8_ =
         (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)local_2a8;
    Fad<double>::operator=
              (flux->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)local_248);
    pTStack_2c0 = (TPZVec<Fad<double>_> *)this->Pi;
    pdStack_2b8 = (double *)0x0;
    pTStack_290 = (TPZVec<Fad<double>_> *)0x0;
    local_288 = &local_1f8;
    pTStack_268 = (TPZVec<Fad<double>_> *)0x0;
    local_220._0_8_ = local_2d0;
    local_2b0 = (TPZVec<Fad<double>_> *)&local_1b0;
    local_298 = pTStack_2c0;
    pTStack_270 = pTStack_2c0;
    local_260 = &local_108;
    local_248._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_220;
    local_248._8_8_ = (TPZVec<Fad<double>_> *)local_280;
    local_220._8_8_ =
         (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)local_2a8;
    Fad<double>::operator=
              (flux->fStore + 1,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)local_248);
    pTStack_2c0 = (TPZVec<Fad<double>_> *)this->Pi;
    pdStack_2b8 = (double *)0x0;
    pTStack_290 = (TPZVec<Fad<double>_> *)0x0;
    local_248._8_8_ = (Fad<double> *)0xc000000000000000;
    local_248._16_8_ = (double *)0x0;
    pTStack_230 = (TPZVec<Fad<double>_> *)local_2d0;
    local_288 = &local_1f8;
    local_220._0_8_ = local_1d8;
    pTStack_268 = (TPZVec<Fad<double>_> *)0x0;
    local_1d8._8_8_ = local_2a8;
    local_2b0 = (TPZVec<Fad<double>_> *)&local_1b0;
    local_298 = pTStack_2c0;
    pTStack_270 = pTStack_2c0;
    local_260 = &local_108;
    local_220._8_8_ = (TPZVec<Fad<double>_> *)local_280;
    local_1d8._0_8_ = (Fad<double> *)local_248;
    Fad<double>::operator=
              (flux->fStore + 2,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)local_220);
    break;
  case ECouplingSD:
    if ((double)local_1f8._vptr_TPZVec < 0.0) {
      local_220._8_8_ = (Fad<double> *)&local_1f8;
      exp<double>((FadExpr<FadFuncExp<Fad<double>_>_> *)local_2d0,(Fad<double> *)&local_1f8);
      local_248._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_220;
      local_248._8_8_ = (Fad<double> *)local_2d0;
      cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a8,&local_1b0);
      local_280._0_8_ = (Fad<double> *)local_248;
      local_280._8_8_ = (Fad<double> *)local_2a8;
      Fad<double>::operator=
                (flux->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                  *)local_280);
      Fad<double>::~Fad((Fad<double> *)(local_2a8 + 8));
      Fad<double>::~Fad((Fad<double> *)(local_2d0 + 8));
      local_220._8_8_ = (Fad<double> *)&local_1f8;
      exp<double>((FadExpr<FadFuncExp<Fad<double>_>_> *)local_2d0,(Fad<double> *)&local_1f8);
      local_248._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_220;
      local_248._8_8_ = (Fad<double> *)local_2d0;
      local_1d8._0_8_ = (Fad<double> *)local_248;
      sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a8,&local_1b0);
      local_280._0_8_ = local_1d8;
      local_280._8_8_ = (TPZVec<Fad<double>_> *)local_2a8;
      Fad<double>::operator=
                (flux->fStore + 1,
                 (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                  *)local_280);
      goto LAB_0121ec36;
    }
    if ((double)local_1f8._vptr_TPZVec < 0.0) break;
    pTStack_2c0 = (TPZVec<Fad<double>_> *)this->Pi;
    pdStack_2b8 = (double *)0x0;
    local_248._8_8_ = 2.0 / (double)pTStack_2c0;
    local_248._16_8_ = (double *)0x0;
    pTStack_290 = (TPZVec<Fad<double>_> *)0x0;
    local_2b0 = &local_1f8;
    local_298 = pTStack_2c0;
    local_288 = &local_1f8;
    local_258 = flux;
    pTStack_230 = (TPZVec<Fad<double>_> *)local_2d0;
    local_1d8._0_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_248;
    local_1d8._8_8_ = (Fad<double> *)local_2a8;
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_280,&local_1b0);
    local_220._0_8_ = local_1d8;
    local_220._8_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_280;
    Fad<double>::operator=
              ((Fad<double> *)(((FadFuncCos<Fad<double>_> *)&local_258->fStore)->expr_).val_,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)local_220);
    Fad<double>::~Fad((Fad<double> *)(local_280 + 8));
    pTStack_2c0 = (TPZVec<Fad<double>_> *)this->Pi;
    local_248._8_8_ = 1.0 / ((double)pTStack_2c0 * (double)pTStack_2c0);
    pdStack_2b8 = (double *)0x0;
    local_248._16_8_ = (double *)0x0;
    pTStack_290 = (TPZVec<Fad<double>_> *)0x0;
    local_220._0_8_ = &local_130;
    local_220._8_8_ = (TPZVec<Fad<double>_> *)0x4000000000000000;
    local_220._16_8_ = (double *)0x0;
    local_2b0 = &local_1f8;
    local_298 = pTStack_2c0;
    local_288 = &local_1f8;
    pTStack_230 = (TPZVec<Fad<double>_> *)local_2d0;
    local_130._0_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_248;
    local_130.fadexpr_.expr_.val_ = (double)local_2a8;
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_280,&local_1b0);
    local_1d8._0_8_ = (Fad<double> *)local_220;
    local_1d8._8_8_ = (TPZVec<Fad<double>_> *)local_280;
    Fad<double>::operator=
              ((Fad<double> *)
               ((long)(((FadFuncCos<Fad<double>_> *)&local_258->fStore)->expr_).val_ + 0x20),
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)local_1d8);
    puVar1 = local_280;
    goto LAB_0121ec45;
  case ECouplingNSD:
    if (1.0 <= (double)local_1f8._vptr_TPZVec) {
      if (1.0 <= (double)local_1f8._vptr_TPZVec) {
        local_2a8._8_8_ = this->Pi;
        local_2d0._8_8_ = local_2a8;
        local_298 = (TPZVec<Fad<double>_> *)0x0;
        local_190._0_8_ = local_2d0;
        pTStack_2c0 = (TPZVec<Fad<double>_> *)0x4000000000000000;
        pdStack_2b8 = (double *)0x0;
        local_280._8_8_ = local_248;
        local_248._16_8_ = (double *)0x0;
        pTStack_270 = (TPZVec<Fad<double>_> *)0x4000000000000000;
        pTStack_268 = (TPZVec<Fad<double>_> *)0x0;
        local_130._0_8_ = &local_190;
        local_1d8._16_8_ = (double *)0x0;
        local_220._16_8_ = (double *)0x4000000000000000;
        pTStack_208 = (TPZVec<Fad<double>_> *)0x0;
        pTStack_290 = &local_1f8;
        local_248._8_8_ = local_2a8._8_8_;
        pTStack_230 = &local_1f8;
        local_220._8_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_1d8;
        local_1d8._8_8_ = local_2a8._8_8_;
        local_1c0 = (TPZVec<Fad<double>_> *)&local_1b0;
        local_190.fadexpr_.expr_.val_ = (double)local_280;
        local_130.fadexpr_.expr_.val_ = (double)local_220;
        Fad<double>::operator=
                  (flux->fStore,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                    *)&local_130);
        pTStack_2c0 = (TPZVec<Fad<double>_> *)this->Pi;
        pTStack_270 = (TPZVec<Fad<double>_> *)0x0;
        local_298 = (TPZVec<Fad<double>_> *)0x4000000000000000;
        pTStack_290 = (TPZVec<Fad<double>_> *)0x0;
        local_130._0_8_ = local_168;
        pdStack_2b8 = (double *)0x0;
        local_168._0_8_ = local_2a8;
        local_2b0 = &local_1f8;
        local_248._8_8_ = (Fad<double> *)0x3fd0000000000000;
        local_248._16_8_ = (double *)0x0;
        local_220._16_8_ = (double *)0x0;
        pTStack_230 = (TPZVec<Fad<double>_> *)local_2d0;
        local_1d8._8_8_ = (TPZVec<Fad<double>_> *)0x4010000000000000;
        local_1d8._16_8_ = (double *)0x0;
        local_190._0_8_ = local_248;
        local_130.fadexpr_.expr_.val_ = (double)&local_190;
        local_2a8._8_8_ = (Fad<double> *)local_280;
        local_280._8_8_ = pTStack_2c0;
        pTStack_268 = (TPZVec<Fad<double>_> *)&local_1b0;
        local_220._8_8_ = pTStack_2c0;
        pTStack_208 = local_2b0;
        local_1d8._0_8_ = (Fad<double> *)local_220;
        local_190.fadexpr_.expr_.val_ = (double)local_1d8;
        Fad<double>::operator=
                  (flux->fStore + 1,
                   (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                    *)&local_130);
      }
    }
    else {
      local_248._8_8_ = this->Pi;
      local_2a8._8_8_ = (double)local_248._8_8_ * -0.125 * (double)local_248._8_8_;
      local_1d8._0_8_ = local_2a8;
      local_298 = (TPZVec<Fad<double>_> *)0x0;
      local_248._16_8_ = (double *)0x0;
      local_1d8._8_8_ = local_280;
      pTStack_270 = (TPZVec<Fad<double>_> *)0x4000000000000000;
      pTStack_268 = (TPZVec<Fad<double>_> *)0x0;
      local_220._0_8_ = local_1d8;
      local_220._8_8_ = local_2d0;
      pTStack_2c0 = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
      pdStack_2b8 = (double *)0x0;
      local_2b0 = &local_1f8;
      pTStack_290 = &local_1f8;
      local_280._8_8_ = (TPZVec<Fad<double>_> *)local_248;
      pTStack_230 = (TPZVec<Fad<double>_> *)&local_1b0;
      Fad<double>::operator=
                (flux->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                  *)local_220);
      local_220._8_8_ = this->Pi;
      local_280._8_8_ = (double)local_220._8_8_ * 0.25;
      local_220._16_8_ = (double *)0x0;
      pTStack_270 = (TPZVec<Fad<double>_> *)0x0;
      local_248._16_8_ = (double *)0x4000000000000000;
      pTStack_230 = (TPZVec<Fad<double>_> *)0x0;
      local_190._0_8_ = local_168;
      pTStack_2c0 = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
      pdStack_2b8 = (double *)0x0;
      local_130._0_8_ = &local_190;
      local_190.fadexpr_.expr_.val_ = (double)local_2d0;
      local_298 = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
      pTStack_290 = (TPZVec<Fad<double>_> *)0x0;
      local_1d8._8_8_ = &local_130;
      local_130.fadexpr_.expr_.val_ = (double)local_2a8;
      local_1d8._0_8_ = local_280;
      local_2b0 = &local_1f8;
      local_288 = &local_1f8;
      pTStack_268 = (TPZVec<Fad<double>_> *)local_248;
      local_248._8_8_ = (Fad<double> *)local_220;
      pTStack_208 = (TPZVec<Fad<double>_> *)&local_1b0;
      local_168._0_8_ = (Fad<double> *)&local_1f8;
      Fad<double>::operator=
                (flux->fStore + 1,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>_>
                  *)local_1d8);
    }
  }
  Fad<double>::~Fad(&local_108);
  Fad<double>::~Fad((Fad<double> *)&local_1f8);
  Fad<double>::~Fad(&local_1b0);
  return;
}

Assistant:

void TStokesAnalytic::uxy(const TPZVec<TVar> &x, TPZVec<TVar> &flux) const
{
    TVar x1 = x[0];
    TVar x2 = x[1];
    TVar x3 = x[2];
    REAL Re = 0.;
    REAL lambda = 0.;
    REAL xs = 0.; 
    
    switch(fExactSol)
    {
        case ESinCos:
            flux[0] = -1.*sin(x1)*sin(x2);
            flux[1] = -1.*cos(x1)*cos(x2);
            break;
        case ENoFlow:
            flux[0] = x1*0.;
            flux[1] = x1*0.;
            break;
        case ESinCosBDS:
	    if(fvisco==0) xs = 0.;
	    xs = 1./exp(fcBrinkman/fvisco);
            flux[0] = -xs*sin(x1)*sin(x2)+(1.-xs)*sin(x1)*sin(x2);
            flux[1] = -xs*cos(x1)*cos(x2)-(1.-xs)*cos(x1)*cos(x2);
            break;
	case ECouplingSD:
	    if(x2<0.){
		flux[0] = (exp(-x2)-exp(x2))*cos(x1);
		flux[1] = -(exp(-x2)+exp(x2))*sin(x1);			
	    }else if(x2>=0.){
		flux[0] = (2./Pi)*sin(Pi*x2)*cos(Pi*x2)*cos(x1);
		flux[1] = ((1./(Pi*Pi))*sin(Pi*x2)*sin(Pi*x2)-2.)*sin(x1);	
	    }
	    break;
	case ECouplingNSD:
	    if(x2<1.){
		flux[0] = -(1./8.)*Pi*Pi*x2*sin(Pi*x1/2.)*sin(1.-x2);
		flux[1] = (1./4.)*Pi*cos(Pi*x1/2.)*(-x2*cos(1.-x2)+sin(1.-x2));			
	    }else if(x2>=1.){
	        flux[0] = cos(Pi*x2/2.)*cos(Pi*x2/2.)*sin(Pi*x1/2.);
	        flux[1] = -cos(Pi*x1/2.)*((1./4.)*sin(Pi*x2)+Pi*x2/4.);	
	    }
	    break;
	case ESinCosBDS3D:
	    xs = 1./exp(fcBrinkman/fvisco);
            flux[0] = -xs*sin(x1)*sin(x2)+(1.-xs)*sin(x1)*sin(x2);
            flux[1] = xs*(-cos(x1)*cos(x2)-sin(x2)*sin(x3))+(1.-xs)*(-cos(x1)*cos(x2)+sin(x2)*sin(x3));
            flux[2] = -xs*cos(x2)*cos(x3)+(1.-xs)*(-cos(x2)*cos(x3));
            break;
	case EGatica3D:
    	    flux[0] = cos(Pi*x1)*sin(Pi*x2)*sin(Pi*x3);
	    flux[1] = sin(Pi*x1)*cos(Pi*x2)*sin(Pi*x3);
	    flux[2] = -2.*sin(Pi*x1)*sin(Pi*x2)*cos(Pi*x3);
	break;
        case ESinCos3D:
            flux[0] = -sin(x1)*sin(x2);
            flux[1] = -cos(x1)*cos(x2)-sin(x2)*sin(x3);
            flux[2] = -cos(x2)*cos(x3);
            break;
        case EKovasznay:
        case EKovasznayCDG:
	    Re = 1./fvisco; //Reynolds number
            lambda = Re/2.- sqrt(Re*Re/4.+4.*Pi*Pi); // Parameter for Navier-Stokes solution
            flux[0] = 1. - exp(lambda*x1)*cos(2.*Pi*x2);
            flux[1] = (lambda/(2.*Pi))*exp(lambda*x1)*sin(2.*Pi*x2);
            break;
        case EPconst:
            flux[0] = x1;
            flux[1] = -x2;
            break;
        default:
            DebugStop();
    }
}